

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsum_os_specific.c
# Opt level: O3

int XSUM_isDirectory(char *filename)

{
  int iVar1;
  XSUM_stat_t statbuf;
  stat64 local_90;
  
  iVar1 = stat64(filename,&local_90);
  if ((iVar1 != 0) || (iVar1 = 1, (local_90.st_mode & 0xf000) != 0x4000)) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

XSUM_API int XSUM_isDirectory(const char* filename)
{
    XSUM_stat_t statbuf;
    int r = XSUM_stat(filename, &statbuf);
#ifdef _MSC_VER
    if (!r && (statbuf.st_mode & _S_IFDIR)) return 1;
#else
    if (!r && S_ISDIR(statbuf.st_mode)) return 1;
#endif
    return 0;
}